

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O0

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_4_3
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  uint32_t scale;
  int32_t local_2c;
  int32_t step;
  int32_t sum2;
  int32_t sum1;
  int32_t sum0;
  uint32_t samp;
  uint32_t numsamples_local;
  ymfm_output<3> *output_local;
  ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this_local;
  
  sum0 = numsamples;
  _samp = output;
  output_local = (ymfm_output<3> *)this;
  for (sum1 = 0; (uint)sum1 < (uint)sum0; sum1 = sum1 + 1) {
    sum2 = 0;
    step = 0;
    local_2c = 0;
    scale = bitfield(this->m_sampindex,0,2);
    add_last(this,&sum2,&step,&local_2c,scale);
    if (scale != 3) {
      clock_and_add(this,&sum2,&step,&local_2c,3 - scale);
    }
    write_to_output(this,_samp,sum2,step,local_2c,3);
    _samp = _samp + 1;
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_4_3(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		int32_t sum0 = 0, sum1 = 0, sum2 = 0;
		int32_t step = bitfield(m_sampindex, 0, 2);
		add_last(sum0, sum1, sum2, step);
		if (step != 3)
			clock_and_add(sum0, sum1, sum2, 3 - step);
		write_to_output(output, sum0, sum1, sum2, 3);
	}
}